

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall wabt::TypeChecker::CheckOpcode2(TypeChecker *this,Opcode opcode,Limits *limits)

{
  Result RVar1;
  Opcode local_7c;
  Info local_78;
  
  local_7c.enum_ = opcode.enum_;
  Opcode::GetInfo(&local_78,&local_7c);
  if ((limits != (Limits *)0x0) &&
     (local_78.param_types[0].enum_ = I32, local_78.param_types[0].type_index_ = 0,
     limits->is_64 != false)) {
    local_78.param_types[0].enum_ = I64;
    local_78.param_types[0].type_index_ = 0;
  }
  Opcode::GetInfo(&local_78,&local_7c);
  Opcode::GetInfo(&local_78,&local_7c);
  RVar1 = PopAndCheck2Types(this,local_78.param_types[0],local_78.param_types[1],local_78.name);
  Opcode::GetInfo(&local_78,&local_7c);
  PushType(this,local_78.result_type);
  return (Result)RVar1.enum_;
}

Assistant:

Result TypeChecker::CheckOpcode2(Opcode opcode, const Limits* limits) {
  Result result =
      PopAndCheck2Types(GetMemoryParam(opcode.GetParamType1(), limits),
                        opcode.GetParamType2(), opcode.GetName());
  PushType(opcode.GetResultType());
  return result;
}